

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

string * __thiscall
slang::CommandLine::Option::set
          (string *__return_storage_ptr__,Option *this,OptionCallback *target,string_view param_2,
          string_view value)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  void *pvVar3;
  size_t sVar4;
  optional<int> oVar6;
  _Storage<int,_true> *p_Var7;
  pointer __s;
  size_t __n;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  ulong uVar8;
  string_view value_00;
  string_view fmt;
  format_args args;
  string sStack_90;
  key_type kStack_68;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  size_t sVar5;
  
  __s = (pointer)param_2._M_len;
  local_18._M_len._0_4_ = (undefined4)value._M_len;
  local_18._M_len._4_4_ = value._M_len._4_4_;
  local_18._M_str._0_4_ = value._M_str._0_4_;
  local_18._M_str._4_4_ = value._M_str._4_4_;
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)(__return_storage_ptr__,(_Any_data *)target,&local_18);
    return __return_storage_ptr__;
  }
  std::__throw_bad_function_call();
  if (__n != 0) {
    pvVar3 = memchr(__s,0x2c,__n);
    uVar8 = -(ulong)(pvVar3 == (void *)0x0) | (long)pvVar3 - (long)__s;
    sVar5 = __n;
    do {
      sVar4 = sVar5 - 1;
      if (sVar5 == 0) {
        sVar4 = 0xffffffffffffffff;
        break;
      }
      lVar1 = sVar5 - 1;
      sVar5 = sVar4;
    } while (__s[lVar1] != ',');
    if (uVar8 != 0xffffffffffffffff && uVar8 == sVar4) {
      lVar1 = uVar8 + 1;
      if (__n <= uVar8) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   lVar1,__n);
      }
      value_00._M_str = __s + lVar1;
      paVar2 = &sStack_90.field_2;
      sStack_90._M_string_length = 0;
      sStack_90.field_2._M_local_buf[0] = '\0';
      value_00._M_len = __n - lVar1;
      sStack_90._M_dataplus._M_p = (pointer)paVar2;
      oVar6 = parseInt<int>((string_view)(ZEXT816(0x3f0621) << 0x40),value_00,&sStack_90);
      if (((ulong)oVar6.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> >> 0x20 & 1) == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_90._M_dataplus._M_p == paVar2) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(sStack_90.field_2._M_allocated_capacity._1_7_,
                        sStack_90.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = sStack_90.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = sStack_90._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(sStack_90.field_2._M_allocated_capacity._1_7_,
                        sStack_90.field_2._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length = sStack_90._M_string_length;
        return __return_storage_ptr__;
      }
      kStack_68._M_dataplus._M_p = (pointer)&kStack_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&kStack_68,__s,__s + uVar8);
      p_Var7 = (_Storage<int,_true> *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&(this->valueName).field_2,&kStack_68);
      p_Var7->_M_value =
           oVar6.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
           _M_payload;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)kStack_68._M_dataplus._M_p != &kStack_68.field_2) {
        operator_delete(kStack_68._M_dataplus._M_p,kStack_68.field_2._M_allocated_capacity + 1);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_90._M_dataplus._M_p == paVar2) {
        return __return_storage_ptr__;
      }
      operator_delete(sStack_90._M_dataplus._M_p,
                      CONCAT71(sStack_90.field_2._M_allocated_capacity._1_7_,
                               sStack_90.field_2._M_local_buf[0]) + 1);
      return __return_storage_ptr__;
    }
  }
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x27;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&sStack_90;
  sStack_90._M_dataplus._M_p = __s;
  sStack_90._M_string_length = __n;
  ::fmt::v9::vformat_abi_cxx11_
            (__return_storage_ptr__,(v9 *)"missing or extra comma in argument \'{}\'",fmt,args);
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(OptionCallback& target, string_view, string_view value) {
    return target(value);
}